

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSetop.c
# Opt level: O3

DdNode * cuddZddSubset1(DdManager *dd,DdNode *P,int var)

{
  int *piVar1;
  DdNode *zvar;
  DdNode *pDVar2;
  
  zvar = cuddUniqueInterZdd(dd,var,dd->one,dd->zero);
  if (zvar != (DdNode *)0x0) {
    piVar1 = (int *)(((ulong)zvar & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar2 = zdd_subset1_aux(dd,P,zvar);
    if (pDVar2 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      Cudd_RecursiveDerefZdd(dd,zvar);
      piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + -1;
      return pDVar2;
    }
    Cudd_RecursiveDerefZdd(dd,zvar);
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
cuddZddSubset1(
  DdManager * dd,
  DdNode * P,
  int  var)
{
    DdNode      *zvar, *r;
    DdNode      *base, *empty;

    base = DD_ONE(dd);
    empty = DD_ZERO(dd);

    zvar = cuddUniqueInterZdd(dd, var, base, empty);
    if (zvar == NULL) {
        return(NULL);
    } else {
        cuddRef(zvar);
        r = zdd_subset1_aux(dd, P, zvar);
        if (r == NULL) {
            Cudd_RecursiveDerefZdd(dd, zvar);
            return(NULL);
        }
        cuddRef(r);
        Cudd_RecursiveDerefZdd(dd, zvar);
    }

    cuddDeref(r);
    return(r);

}